

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_lib.cc
# Opt level: O0

void init_lib(module *m)

{
  class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *pcVar1;
  class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
  *pcVar2;
  code *local_1f0;
  undefined8 local_1e8;
  code *local_1e0;
  undefined8 local_1d8;
  code *local_1d0;
  undefined8 local_1c8;
  code *local_1c0;
  undefined8 local_1b8;
  code *local_1b0;
  undefined8 local_1a8;
  code *local_1a0;
  undefined8 local_198;
  code *local_190;
  undefined8 local_188;
  code *local_180;
  undefined8 local_178;
  code *local_170;
  undefined8 local_168;
  code *local_160;
  undefined8 local_158;
  code *local_150;
  undefined8 local_148;
  code *local_140;
  undefined8 local_138;
  code *local_130;
  undefined8 local_128;
  code *local_120;
  undefined8 local_118;
  code *local_110;
  undefined8 local_108;
  code *local_100;
  undefined8 local_f8;
  code *local_f0;
  undefined8 local_e8;
  code *local_e0;
  undefined8 local_d8;
  code *local_d0;
  undefined8 local_c8;
  constructor<kratos::Context_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int,_std::shared_ptr<kratos::asic::SinglePortSRAM>_&>
  local_bb [2];
  constructor<kratos::Context_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short,_unsigned_short,_bool>
  local_b9;
  handle local_b8;
  class_<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_kratos::asic::SRAM>
  local_b0;
  class_<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_kratos::asic::SRAM>
  single_sram;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  code *local_68;
  undefined8 local_60;
  code *local_58;
  undefined8 local_50;
  offset_in_Var_to_subr local_48 [4];
  handle local_28;
  class_<kratos::asic::SRAM,_std::shared_ptr<kratos::asic::SRAM>,_kratos::Generator> local_20;
  class_<kratos::asic::SRAM,_std::shared_ptr<kratos::asic::SRAM>,_kratos::Generator> sram;
  module_ lib_m;
  module *m_local;
  
  pybind11::module_::def_submodule((module_ *)&sram,(char *)m,"lib");
  local_28.m_ptr = (PyObject *)sram.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::class_<kratos::asic::SRAM,_std::shared_ptr<kratos::asic::SRAM>,_kratos::Generator>::
  class_<>(&local_20,(handle)sram.super_generic_type.super_object.super_handle.m_ptr,"SRAM");
  local_48[1] = 0;
  local_48[0] = 0x41;
  pcVar1 = (class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *)
           pybind11::
           class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
           def_property_readonly<unsigned_int(kratos::asic::SRAM::*)()>
                     ((class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>
                       *)&local_20,"num_ports",local_48);
  local_58 = kratos::asic::SRAM::clock;
  local_50 = 0;
  pcVar1 = (class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *)
           pybind11::
           class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
           def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SRAM::*)()>
                     (pcVar1,"clock",(offset_in_Var_to_subr *)&local_58);
  local_68 = kratos::asic::SRAM::addr_width;
  local_60 = 0;
  pcVar1 = (class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *)
           pybind11::
           class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
           def_property_readonly<unsigned_short(kratos::asic::SRAM::*)()>
                     (pcVar1,"addr_width",(offset_in_Var_to_subr *)&local_68);
  local_78 = kratos::asic::SRAM::data_width;
  local_70 = 0;
  pcVar1 = (class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *)
           pybind11::
           class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
           def_property_readonly<unsigned_short(kratos::asic::SRAM::*)()>
                     (pcVar1,"data_width",(offset_in_Var_to_subr *)&local_78);
  local_88 = kratos::asic::SRAM::clock_name_abi_cxx11_;
  local_80 = 0;
  local_98 = kratos::asic::SRAM::set_clock_name;
  local_90 = 0;
  pcVar1 = (class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator> *)
           pybind11::
           class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
           def_property<std::__cxx11::string(kratos::asic::SRAM::*)()const,void(kratos::asic::SRAM::*)(std::__cxx11::string_const&)>
                     (pcVar1,"clock_name",(offset_in_Var_to_subr *)&local_88,
                      (offset_in_Var_to_subr *)&local_98);
  single_sram.super_generic_type.super_object.super_handle.m_ptr =
       (generic_type)kratos::asic::SRAM::capacity;
  pybind11::class_<kratos::asic::SRAM,std::shared_ptr<kratos::asic::SRAM>,kratos::Generator>::
  def<unsigned_int(kratos::asic::SRAM::*)()const>
            (pcVar1,"capacity",(offset_in_Var_to_subr *)&single_sram);
  local_b8.m_ptr = (PyObject *)sram.super_generic_type.super_object.super_handle.m_ptr;
  pybind11::
  class_<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_kratos::asic::SRAM>
  ::class_<>(&local_b0,(handle)sram.super_generic_type.super_object.super_handle.m_ptr,
             "SinglePortSRAM");
  pybind11::init<kratos::Context*,std::__cxx11::string_const&,unsigned_short,unsigned_short,bool>();
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::def<kratos::Context*,std::__cxx11::string_const&,unsigned_short,unsigned_short,bool>
                        ((class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
                          *)&local_b0,&local_b9);
  pybind11::
  init<kratos::Context*,std::__cxx11::string_const&,unsigned_int,std::shared_ptr<kratos::asic::SinglePortSRAM>&>
            ();
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def<kratos::Context*,std::__cxx11::string_const&,unsigned_int,std::shared_ptr<kratos::asic::SinglePortSRAM>&>
                        (pcVar2,local_bb);
  local_d0 = kratos::asic::SinglePortSRAM::output_data;
  local_c8 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        (pcVar2,"output_data",(offset_in_Var_to_subr *)&local_d0);
  local_e0 = kratos::asic::SinglePortSRAM::chip_enable;
  local_d8 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        (pcVar2,"chip_enable",(offset_in_Var_to_subr *)&local_e0);
  local_f0 = kratos::asic::SinglePortSRAM::write_enable;
  local_e8 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        (pcVar2,"write_enable",(offset_in_Var_to_subr *)&local_f0);
  local_100 = kratos::asic::SinglePortSRAM::addr;
  local_f8 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        (pcVar2,"addr",(offset_in_Var_to_subr *)&local_100);
  local_110 = kratos::asic::SinglePortSRAM::input_data;
  local_108 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        (pcVar2,"input_data",(offset_in_Var_to_subr *)&local_110);
  local_120 = kratos::asic::SinglePortSRAM::partial_write_mask;
  local_118 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property_readonly<std::shared_ptr<kratos::Port>(kratos::asic::SinglePortSRAM::*)()>
                        (pcVar2,"partial_write_mask",(offset_in_Var_to_subr *)&local_120);
  local_130 = kratos::asic::SinglePortSRAM::output_data_name_abi_cxx11_;
  local_128 = 0;
  local_140 = kratos::asic::SinglePortSRAM::set_output_data_name;
  local_138 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"output_data_name",(offset_in_Var_to_subr *)&local_130,
                         (offset_in_Var_to_subr *)&local_140);
  local_150 = kratos::asic::SinglePortSRAM::chip_enable_name_abi_cxx11_;
  local_148 = 0;
  local_160 = kratos::asic::SinglePortSRAM::set_chip_enable_name;
  local_158 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"chip_enable_name",(offset_in_Var_to_subr *)&local_150,
                         (offset_in_Var_to_subr *)&local_160);
  local_170 = kratos::asic::SinglePortSRAM::write_enable_name_abi_cxx11_;
  local_168 = 0;
  local_180 = kratos::asic::SinglePortSRAM::set_write_enable_name;
  local_178 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"write_enable_name",(offset_in_Var_to_subr *)&local_170,
                         (offset_in_Var_to_subr *)&local_180);
  local_190 = kratos::asic::SinglePortSRAM::addr_name_abi_cxx11_;
  local_188 = 0;
  local_1a0 = kratos::asic::SinglePortSRAM::set_addr_name;
  local_198 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"addr_name",(offset_in_Var_to_subr *)&local_190,
                         (offset_in_Var_to_subr *)&local_1a0);
  local_1b0 = kratos::asic::SinglePortSRAM::input_data_name_abi_cxx11_;
  local_1a8 = 0;
  local_1c0 = kratos::asic::SinglePortSRAM::set_input_data_name;
  local_1b8 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"input_data_name",(offset_in_Var_to_subr *)&local_1b0,
                         (offset_in_Var_to_subr *)&local_1c0);
  local_1d0 = kratos::asic::SinglePortSRAM::partial_write_mask_name_abi_cxx11_;
  local_1c8 = 0;
  local_1e0 = kratos::asic::SinglePortSRAM::set_partial_write_mask_name;
  local_1d8 = 0;
  pcVar2 = (class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
            *)pybind11::
              class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
              ::
              def_property<std::__cxx11::string(kratos::asic::SinglePortSRAM::*)()const,void(kratos::asic::SinglePortSRAM::*)(std::__cxx11::string_const&)>
                        (pcVar2,"partial_write_mask_name",(offset_in_Var_to_subr *)&local_1d0,
                         (offset_in_Var_to_subr *)&local_1e0);
  local_1f0 = kratos::asic::SinglePortSRAM::partial_write;
  local_1e8 = 0;
  pybind11::
  class_<kratos::asic::SinglePortSRAM,std::shared_ptr<kratos::asic::SinglePortSRAM>,kratos::asic::SRAM>
  ::def_property_readonly<bool(kratos::asic::SinglePortSRAM::*)()const>
            (pcVar2,"partial_write",(offset_in_Var_to_subr *)&local_1f0);
  pybind11::
  class_<kratos::asic::SinglePortSRAM,_std::shared_ptr<kratos::asic::SinglePortSRAM>,_kratos::asic::SRAM>
  ::~class_(&local_b0);
  pybind11::class_<kratos::asic::SRAM,_std::shared_ptr<kratos::asic::SRAM>,_kratos::Generator>::
  ~class_(&local_20);
  pybind11::module_::~module_((module_ *)&sram);
  return;
}

Assistant:

void init_lib(py::module &m) {
    using namespace kratos;
    using namespace kratos::asic;
    // sub module
    auto lib_m = m.def_submodule("lib");

    // define sram
    auto sram = py::class_<SRAM, std::shared_ptr<SRAM>, Generator>(lib_m, "SRAM");
    sram.def_property_readonly("num_ports", &SRAM::num_ports)
        .def_property_readonly("clock", &SRAM::clock)
        .def_property_readonly("addr_width", &SRAM::addr_width)
        .def_property_readonly("data_width", &SRAM::data_width)
        .def_property("clock_name", &SRAM::clock_name, &SRAM::set_clock_name)
        .def("capacity", &SRAM::capacity);

    // define single port sram
    auto single_sram =
        py::class_<SinglePortSRAM, std::shared_ptr<SinglePortSRAM>, SRAM>(lib_m, "SinglePortSRAM");
    single_sram.def(py::init<Context *, const std::string &, uint16_t, uint16_t, bool>())
        .def(
            py::init<Context *, const std::string &, uint32_t, std::shared_ptr<SinglePortSRAM> &>())
        .def_property_readonly("output_data", &SinglePortSRAM::output_data)
        .def_property_readonly("chip_enable", &SinglePortSRAM::chip_enable)
        .def_property_readonly("write_enable", &SinglePortSRAM::write_enable)
        .def_property_readonly("addr", &SinglePortSRAM::addr)
        .def_property_readonly("input_data", &SinglePortSRAM::input_data)
        .def_property_readonly("partial_write_mask", &SinglePortSRAM::partial_write_mask)
        .def_property("output_data_name", &SinglePortSRAM::output_data_name,
                      &SinglePortSRAM::set_output_data_name)
        .def_property("chip_enable_name", &SinglePortSRAM::chip_enable_name,
                      &SinglePortSRAM::set_chip_enable_name)
        .def_property("write_enable_name", &SinglePortSRAM::write_enable_name,
                      &SinglePortSRAM::set_write_enable_name)
        .def_property("addr_name", &SinglePortSRAM::addr_name, &SinglePortSRAM::set_addr_name)
        .def_property("input_data_name", &SinglePortSRAM::input_data_name,
                      &SinglePortSRAM::set_input_data_name)
        .def_property("partial_write_mask_name", &SinglePortSRAM::partial_write_mask_name,
                      &SinglePortSRAM::set_partial_write_mask_name)
        .def_property_readonly("partial_write", &SinglePortSRAM::partial_write);
}